

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

timestamp_t __thiscall
duckdb::TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (OriginWidthConvertibleToMicrosTernaryOperator *this,interval_t bucket_width,
          timestamp_t ts,timestamp_t origin)

{
  bool bVar1;
  int64_t right;
  int64_t left;
  int64_t iVar2;
  long lVar3;
  timestamp_t tVar4;
  long left_00;
  undefined1 auVar5 [16];
  timestamp_t result;
  timestamp_t local_60;
  string local_58;
  OriginWidthConvertibleToMicrosTernaryOperator *local_38;
  int64_t local_30;
  
  tVar4.value = bucket_width.micros;
  local_30 = bucket_width._0_8_;
  local_38 = this;
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(tVar4);
  if (bVar1) {
    right = Interval::GetMicro((interval_t *)&local_38);
    bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(tVar4,&local_60,false);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_58,(duckdb *)tVar4.value,(timestamp_t)auVar5._8_8_);
      InvalidInputException::InvalidInputException(auVar5._0_8_,&local_58);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    left = Timestamp::GetEpochMicroSeconds(local_60);
    bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(ts,&local_60,false);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_58,(duckdb *)ts.value,(timestamp_t)auVar5._8_8_);
      InvalidInputException::InvalidInputException(auVar5._0_8_,&local_58);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    iVar2 = Timestamp::GetEpochMicroSeconds(local_60);
    lVar3 = SubtractOperatorOverflowCheck::Operation<long,long,long>(left,iVar2 % right);
    left_00 = lVar3 - lVar3 % right;
    if (lVar3 % right != 0 && lVar3 < 0) {
      left_00 = SubtractOperatorOverflowCheck::Operation<long,long,long>(left_00,right);
    }
    tVar4 = Timestamp::FromEpochMicroSeconds(left_00 + iVar2 % right);
    bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(tVar4,&local_60,false);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_58,(duckdb *)tVar4.value,(timestamp_t)auVar5._8_8_);
      InvalidInputException::InvalidInputException(auVar5._0_8_,&local_58);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(tVar4,&local_60,false);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_58,(duckdb *)tVar4.value,(timestamp_t)auVar5._8_8_);
      InvalidInputException::InvalidInputException(auVar5._0_8_,&local_58);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  return (timestamp_t)local_60.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(ts));
			int64_t origin_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(origin));
			return Cast::template Operation<timestamp_t, TR>(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, origin_micros));
		}